

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O3

JavascriptArray * __thiscall
JsrtDebugManager::GetScripts(JsrtDebugManager *this,ScriptContext *scriptContext)

{
  byte bVar1;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar2;
  Utf8SourceInfo *this_00;
  bool bVar3;
  int iVar4;
  JavascriptArray *this_01;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar5;
  Utf8SourceInfo *this_02;
  DynamicObject *object;
  Var newValue;
  uint32 itemIndex;
  long lVar6;
  Utf8SourceInfo *strongRef;
  ScriptContext *pSVar7;
  
  this_01 = Js::JavascriptLibrary::CreateArray
                      ((scriptContext->super_ScriptContextBase).javascriptLibrary);
  pSVar7 = scriptContext->threadContext->scriptContextList;
  if (pSVar7 != (ScriptContext *)0x0) {
    itemIndex = 0;
    do {
      iVar4 = (*(pSVar7->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(pSVar7);
      if ((char)iVar4 != '\0') {
        return this_01;
      }
      pLVar5 = Memory::
               RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
               ::operator->(&pSVar7->sourceList);
      if (0 < (pLVar5->
              super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
              ).count) {
        lVar6 = 0;
        do {
          pRVar2 = (pLVar5->
                   super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                   ).buffer.ptr[lVar6].ptr;
          if ((((((ulong)pRVar2 & 1) == 0 &&
                 pRVar2 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) &&
               (this_00 = (Utf8SourceInfo *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef,
               this_00 != (Utf8SourceInfo *)0x0)) && ((this_00->field_0xa8 & 4) == 0)) &&
             ((this_00->m_debugDocument).ptr != (DebugDocument *)0x0)) {
            bVar3 = Js::Utf8SourceInfo::IsDynamic(this_00);
            if ((bVar3) &&
               (this_02 = Js::Utf8SourceInfo::GetCallerUtf8SourceInfo(this_00),
               this_02 != (Utf8SourceInfo *)0x0)) {
              do {
                bVar1 = this_02->field_0xa8;
                this_02 = Js::Utf8SourceInfo::GetCallerUtf8SourceInfo(this_02);
                if (this_02 == (Utf8SourceInfo *)0x0) break;
              } while ((bVar1 & 4) == 0);
              if ((bVar1 & 4) != 0) goto LAB_003a3979;
            }
            object = Js::JavascriptLibrary::CreateObject
                               ((((this_00->m_scriptContext).ptr)->super_ScriptContextBase).
                                javascriptLibrary,false,0);
            JsrtDebugUtils::AddSourceMetadataToObject(object,this_00);
            if (object != (DynamicObject *)0x0) {
              newValue = Js::CrossSite::MarshalVar(scriptContext,object,false);
              Js::JavascriptArray::DirectSetItemAt<void*>(this_01,itemIndex,newValue);
              itemIndex = itemIndex + 1;
            }
          }
LAB_003a3979:
          lVar6 = lVar6 + 1;
        } while (lVar6 < (pLVar5->
                         super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                         ).count);
      }
      pSVar7 = pSVar7->next;
    } while (pSVar7 != (ScriptContext *)0x0);
  }
  return this_01;
}

Assistant:

Js::JavascriptArray* JsrtDebugManager::GetScripts(Js::ScriptContext* scriptContext)
{
    Js::JavascriptArray* scriptsArray = scriptContext->GetLibrary()->CreateArray();

    int index = 0;

    for (Js::ScriptContext *tempScriptContext = scriptContext->GetThreadContext()->GetScriptContextList();
    tempScriptContext != nullptr && !tempScriptContext->IsClosed();
        tempScriptContext = tempScriptContext->next)
    {
        tempScriptContext->MapScript([&](Js::Utf8SourceInfo* utf8SourceInfo)
        {
            if (!utf8SourceInfo->GetIsLibraryCode() && utf8SourceInfo->HasDebugDocument())
            {
                bool isCallerLibraryCode = false;

                bool isDynamic = utf8SourceInfo->IsDynamic();

                if (isDynamic)
                {
                    // If the code is dynamic (eval or new Function) only return the script if parent is non-library
                    Js::Utf8SourceInfo* callerUtf8SourceInfo = utf8SourceInfo->GetCallerUtf8SourceInfo();

                    while (callerUtf8SourceInfo != nullptr && !isCallerLibraryCode)
                    {
                        isCallerLibraryCode = callerUtf8SourceInfo->GetIsLibraryCode();
                        callerUtf8SourceInfo = callerUtf8SourceInfo->GetCallerUtf8SourceInfo();
                    }
                }

                if (!isCallerLibraryCode)
                {
                    Js::DynamicObject* sourceObj = this->GetScript(utf8SourceInfo);

                    if (sourceObj != nullptr)
                    {
                        Js::Var marshaledObj = Js::CrossSite::MarshalVar(scriptContext, sourceObj);
                        scriptsArray->DirectSetItemAt(index, marshaledObj);
                        index++;
                    }
                }
            }
        });
    }

    return scriptsArray;
}